

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O3

void xmlAttrDumpOutput(xmlSaveCtxtPtr ctxt,xmlAttrPtr cur)

{
  xmlOutputBufferPtr out;
  xmlChar *pxVar1;
  int iVar2;
  
  if ((cur == (xmlAttrPtr)0x0) || (out = ctxt->buf, out == (xmlOutputBufferPtr)0x0)) {
    return;
  }
  if (ctxt->format == 2) {
    xmlOutputBufferWriteWSNonSig(ctxt,2);
  }
  else {
    xmlOutputBufferWrite(out,1," ");
  }
  if ((cur->ns != (xmlNs *)0x0) && (pxVar1 = cur->ns->prefix, pxVar1 != (xmlChar *)0x0)) {
    xmlOutputBufferWriteString(out,(char *)pxVar1);
    xmlOutputBufferWrite(out,1,":");
  }
  xmlOutputBufferWriteString(out,(char *)cur->name);
  xmlOutputBufferWrite(out,2,"=\"");
  if ((((ctxt->options & 0x10) != 0) && (cur->ns == (xmlNs *)0x0)) &&
     ((cur->children == (_xmlNode *)0x0 ||
      ((pxVar1 = cur->children->content, pxVar1 == (xmlChar *)0x0 || (*pxVar1 == '\0')))))) {
    iVar2 = htmlIsBooleanAttr(cur->name);
    if (iVar2 != 0) {
      xmlOutputBufferWriteString(out,(char *)cur->name);
      goto LAB_0017354d;
    }
  }
  xmlSaveWriteAttrContent(ctxt,cur);
LAB_0017354d:
  xmlOutputBufferWrite(out,1,"\"");
  return;
}

Assistant:

static void
xmlAttrDumpOutput(xmlSaveCtxtPtr ctxt, xmlAttrPtr cur) {
    xmlOutputBufferPtr buf;

    if (cur == NULL) return;
    buf = ctxt->buf;
    if (buf == NULL) return;
    if (ctxt->format == 2)
        xmlOutputBufferWriteWSNonSig(ctxt, 2);
    else
        xmlOutputBufferWrite(buf, 1, " ");
    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
        xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
	xmlOutputBufferWrite(buf, 1, ":");
    }
    xmlOutputBufferWriteString(buf, (const char *)cur->name);
    xmlOutputBufferWrite(buf, 2, "=\"");
#ifdef LIBXML_HTML_ENABLED
    if ((ctxt->options & XML_SAVE_XHTML) &&
        (cur->ns == NULL) &&
        ((cur->children == NULL) ||
         (cur->children->content == NULL) ||
         (cur->children->content[0] == 0)) &&
        (htmlIsBooleanAttr(cur->name))) {
        xmlOutputBufferWriteString(buf, (const char *) cur->name);
    } else
#endif
    {
        xmlSaveWriteAttrContent(ctxt, cur);
    }
    xmlOutputBufferWrite(buf, 1, "\"");
}